

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTests.cpp
# Opt level: O1

TestCaseGroup * vkt::sparse::createTests(TestContext *testCtx)

{
  TestNode *this;
  TestNode *pTVar1;
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"sparse_resources","Sparse Resources Tests");
  pTVar1 = &createSparseBufferTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = &createImageSparseBindingTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = &createImageSparseResidencyTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = &createMipmapSparseResidencyTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = &createImageSparseMemoryAliasingTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = &createSparseResourcesShaderIntrinsicsTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = &createQueueBindSparseTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar1);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> sparseTests (new tcu::TestCaseGroup(testCtx, "sparse_resources", "Sparse Resources Tests"));

	sparseTests->addChild(createSparseBufferTests					(testCtx));
	sparseTests->addChild(createImageSparseBindingTests				(testCtx));
	sparseTests->addChild(createImageSparseResidencyTests			(testCtx));
	sparseTests->addChild(createMipmapSparseResidencyTests			(testCtx));
	sparseTests->addChild(createImageSparseMemoryAliasingTests		(testCtx));
	sparseTests->addChild(createSparseResourcesShaderIntrinsicsTests(testCtx));
	sparseTests->addChild(createQueueBindSparseTests				(testCtx));

	return sparseTests.release();
}